

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_gradient_v_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color top,rf_color bottom,
          rf_color *dst,rf_int dst_size)

{
  char cVar1;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  ulong uVar11;
  undefined1 auVar12 [13];
  undefined1 auVar13 [16];
  long lVar14;
  rf_int i;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  rf_color *prVar19;
  short sVar20;
  float fVar21;
  rf_color rVar23;
  undefined1 auVar25 [16];
  float fVar26;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar22;
  undefined6 uVar24;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  auVar13 = _DAT_0016fd00;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (width * height * 4 <= dst_size) {
    lVar14 = (long)width;
    auVar7[0xc] = bottom.a;
    auVar7._0_12_ = ZEXT712(0);
    uVar11 = (ulong)top._0_2_ & 0xffffffffffff00ff;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar11;
    auVar8[0xc] = top.a;
    auVar9[8] = top.b;
    auVar9._0_8_ = uVar11;
    auVar9[9] = 0;
    auVar9._10_3_ = auVar8._10_3_;
    auVar12._5_8_ = 0;
    auVar12._0_5_ = auVar9._8_5_;
    auVar10[4] = top.g;
    auVar10._0_4_ = (int)uVar11;
    auVar10[5] = 0;
    auVar10._6_7_ = SUB137(auVar12 << 0x40,6);
    uVar16 = 0;
    lVar17 = 0;
    if (0 < lVar14) {
      lVar17 = lVar14;
    }
    uVar18 = 0;
    prVar19 = dst;
    if (0 < height) {
      uVar18 = (ulong)(uint)height;
    }
    for (; uVar16 != uVar18; uVar16 = uVar16 + 1) {
      fVar21 = (float)(long)uVar16 / (float)height;
      fVar26 = 1.0 - fVar21;
      auVar25._0_4_ = (int)(fVar21 * (float)((uint)bottom & 0xff) + fVar26 * (float)(int)uVar11);
      auVar25._4_4_ =
           (int)(fVar21 * (float)((uint)bottom >> 8 & 0xff) + fVar26 * (float)auVar10._4_4_);
      auVar25._8_4_ =
           (int)(fVar21 * (float)(int)CONCAT32(auVar7._10_3_,(ushort)bottom.b) +
                fVar26 * (float)auVar9._8_4_);
      auVar25._12_4_ =
           (int)(fVar21 * (float)(uint3)(auVar7._10_3_ >> 0x10) +
                fVar26 * (float)(uint3)(auVar8._10_3_ >> 0x10));
      auVar25 = auVar25 & auVar13;
      sVar5 = auVar25._0_2_;
      cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar25[0] - (0xff < sVar5);
      sVar5 = auVar25._2_2_;
      sVar20 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar25[2] - (0xff < sVar5),cVar1);
      sVar5 = auVar25._4_2_;
      cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar25[4] - (0xff < sVar5);
      sVar5 = auVar25._6_2_;
      uVar22 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar25[6] - (0xff < sVar5),
                        CONCAT12(cVar2,sVar20));
      sVar5 = auVar25._8_2_;
      cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar25[8] - (0xff < sVar5);
      sVar5 = auVar25._10_2_;
      uVar24 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar25[10] - (0xff < sVar5),
                        CONCAT14(cVar3,uVar22));
      sVar5 = auVar25._12_2_;
      cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar25[0xc] - (0xff < sVar5);
      sVar6 = auVar25._14_2_;
      sVar5 = (short)((uint)uVar22 >> 0x10);
      rVar23.g = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
      rVar23.r = (0 < sVar20) * (sVar20 < 0x100) * cVar1 - (0xff < sVar20);
      sVar5 = (short)((uint6)uVar24 >> 0x20);
      rVar23.b = (0 < sVar5) * (sVar5 < 0x100) * cVar3 - (0xff < sVar5);
      sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar25[0xe] - (0xff < sVar6),
                               CONCAT16(cVar4,uVar24)) >> 0x30);
      rVar23.a = (0 < sVar5) * (sVar5 < 0x100) * cVar4 - (0xff < sVar5);
      for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 1) {
        prVar19[lVar15] = rVar23;
      }
      prVar19 = prVar19 + lVar14;
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_v_to_buffer(int width, int height, rf_color top, rf_color bottom, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int j = 0; j < height; j++)
        {
            float factor = ((float)j) / ((float)height);

            for (rf_int i = 0; i < width; i++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)bottom.r * factor + (float)top.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)bottom.g * factor + (float)top.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)bottom.b * factor + (float)top.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)bottom.a * factor + (float)top.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}